

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

iterator __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,google::protobuf::compiler::java::FieldGeneratorInfo>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,google::protobuf::compiler::java::FieldGeneratorInfo>>>
::find<google::protobuf::FieldDescriptor_const*>
          (raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,google::protobuf::compiler::java::FieldGeneratorInfo>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,google::protobuf::compiler::java::FieldGeneratorInfo>>>
           *this,key_arg<const_google::protobuf::FieldDescriptor_*> *key)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint64_t v;
  iterator iVar3;
  
  AssertHashEqConsistent<google::protobuf::FieldDescriptor_const*>(this,key);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (key_arg<const_google::protobuf::FieldDescriptor_*>)
                 ((long)&hash_internal::MixingHashState::kSeed + (long)*key);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *key + (SUB168(auVar1 * ZEXT816(0x9ddfea08eb382d69),0) ^
                        SUB168(auVar1 * ZEXT816(0x9ddfea08eb382d69),8));
  iVar3 = find_non_soo<google::protobuf::FieldDescriptor_const*>
                    (this,key,SUB168(auVar2 * ZEXT816(0x9ddfea08eb382d69),8) ^
                              SUB168(auVar2 * ZEXT816(0x9ddfea08eb382d69),0));
  return iVar3;
}

Assistant:

iterator find(const key_arg<K>& key) ABSL_ATTRIBUTE_LIFETIME_BOUND {
    AssertHashEqConsistent(key);
    if (is_soo()) return find_soo(key);
    prefetch_heap_block();
    return find_non_soo(key, hash_ref()(key));
  }